

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  long in_RSI;
  size_t in_RDI;
  void *__arg;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outh;
  int _outw;
  int _coffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *this_00;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  Mat *this_01;
  Mat *in_stack_fffffffffffffe50;
  int local_130;
  int *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  Mat *in_stack_fffffffffffffef8;
  Crop *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  Mat local_98;
  Mat local_58;
  int local_4;
  
  local_58.w = *(int *)(in_RSI + 0x2c);
  local_58.dims = *(int *)(in_RSI + 0x30);
  local_58.allocator._4_4_ = *(int *)(in_RSI + 0x34);
  local_58.allocator._0_4_ = *(int *)(in_RSI + 0x28);
  local_58._24_8_ = *(long *)(in_RSI + 0x10);
  this_01 = &local_98;
  Mat::shape(this_01);
  this_00 = &local_58;
  __arg = (void *)((long)&local_58.refcount + 4);
  resolve_crop_roi(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  Mat::~Mat((Mat *)0x149482);
  iVar3 = (int)((ulong)this_01 >> 0x20);
  if ((int)local_58.allocator == 1) {
    if ((int)local_58.refcount == local_58.w) {
      Mat::operator=((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                     this_00);
      local_4 = 0;
    }
    else {
      Mat::create(in_stack_fffffffffffffe50,iVar3,in_RDI,
                  (Allocator *)
                  CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
      bVar1 = Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_58._24_8_ == 1) {
          copy_cut_border_image<signed_char>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        if (local_58._24_8_ == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        if (local_58._24_8_ == 4) {
          copy_cut_border_image<float>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        local_4 = 0;
      }
    }
  }
  else if ((int)local_58.allocator == 2) {
    if (((int)local_58.refcount == local_58.w) && (local_58.data._4_4_ == local_58.dims)) {
      Mat::operator=((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                     this_00);
      local_4 = 0;
    }
    else {
      Mat::create(in_stack_fffffffffffffe50,iVar3,(int)this_01,in_RDI,
                  (Allocator *)
                  CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
      bVar1 = Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_58._24_8_ == 1) {
          copy_cut_border_image<signed_char>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        if (local_58._24_8_ == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        if (local_58._24_8_ == 4) {
          copy_cut_border_image<float>
                    (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
        }
        local_4 = 0;
      }
    }
  }
  else if ((int)local_58.allocator == 3) {
    if ((((int)local_58.refcount == local_58.w) && (local_58.data._4_4_ == local_58.dims)) &&
       ((int)local_58.data == local_58.allocator._4_4_)) {
      Mat::operator=((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                     this_00);
      local_4 = 0;
    }
    else {
      iVar3 = (int)local_58.data;
      Mat::channel_range(this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
      if (((int)local_58.refcount == local_58.w) && (local_58.data._4_4_ == local_58.dims)) {
        Mat::clone((Mat *)&stack0xfffffffffffffed8,(__fn *)&stack0xffffffffffffff18,(void *)0x0,
                   iVar3,__arg);
        Mat::operator=((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                       CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)
                                      ),this_00);
        Mat::~Mat((Mat *)0x1497ed);
        bVar1 = Mat::empty(this_00);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        Mat::create(in_stack_fffffffffffffe50,(int)((ulong)this_01 >> 0x20),(int)this_01,
                    (int)(in_RDI >> 0x20),
                    CONCAT17(in_stack_fffffffffffffe3f,
                             CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                    (Allocator *)this_00);
        uVar2 = Mat::empty(this_00);
        if ((bool)uVar2) {
          local_4 = -100;
        }
        else {
          for (local_130 = 0; local_130 < (int)local_58.data; local_130 = local_130 + 1) {
            Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                         CONCAT16(uVar2,in_stack_fffffffffffffe38)),
                         (int)((ulong)this_00 >> 0x20));
            Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffe3f,
                                         CONCAT16(uVar2,in_stack_fffffffffffffe38)),
                         (int)((ulong)this_00 >> 0x20));
            if (local_58._24_8_ == 1) {
              copy_cut_border_image<signed_char>
                        (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
            }
            if (local_58._24_8_ == 2) {
              copy_cut_border_image<unsigned_short>
                        (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
            }
            if (local_58._24_8_ == 4) {
              copy_cut_border_image<float>
                        (in_stack_fffffffffffffe50,this_01,(int)(in_RDI >> 0x20),(int)in_RDI);
            }
            Mat::~Mat((Mat *)0x149a0e);
            Mat::~Mat((Mat *)0x149a18);
          }
          local_4 = 0;
        }
      }
      Mat::~Mat((Mat *)0x149a5d);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}